

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::CanGenerateInstallNameDir(cmGeneratorTarget *this,InstallNameType name_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  PolicyStatus PVar5;
  string local_48;
  
  PVar5 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0068);
  bVar3 = true;
  if (PVar5 != NEW) {
    pcVar2 = this->Makefile;
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_SKIP_RPATH","");
    bVar3 = cmMakefile::IsOn(pcVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (name_type == INSTALL_NAME_FOR_INSTALL) {
      pcVar2 = this->Makefile;
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_SKIP_INSTALL_RPATH","");
      bVar4 = cmMakefile::IsOn(pcVar2,&local_48);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SKIP_BUILD_RPATH","");
      bVar4 = cmTarget::GetPropertyAsBool(this->Target,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((PVar5 == WARN) && ((bVar3 | bVar4) != 0)) {
      cmGlobalGenerator::AddCMP0068WarnTarget
                (this->LocalGenerator->GlobalGenerator,&this->Target->Name);
    }
    bVar3 = (bool)((bVar3 | bVar4) ^ 1);
  }
  return bVar3;
}

Assistant:

bool cmGeneratorTarget::CanGenerateInstallNameDir(
  InstallNameType name_type) const
{
  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();

  if (cmp0068 == cmPolicies::NEW) {
    return true;
  }

  bool skip = this->Makefile->IsOn("CMAKE_SKIP_RPATH");
  if (name_type == INSTALL_NAME_FOR_INSTALL) {
    skip |= this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH");
  } else {
    skip |= this->GetPropertyAsBool("SKIP_BUILD_RPATH");
  }

  if (skip && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return !skip;
}